

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn)

{
  uint uVar1;
  u16 *puVar2;
  double dVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  WhereClause *pWVar7;
  sqlite3_index_constraint_usage *__s;
  WhereLoop *pTemplate;
  Parse *pParse;
  SrcList *pSVar8;
  WhereTerm *pWVar9;
  sqlite3_vtab *psVar10;
  sqlite3 *psVar11;
  bool bVar12;
  i8 iVar13;
  LogEst LVar14;
  uint uVar15;
  uchar *puVar16;
  VTable *pVVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  int iVar21;
  long lVar22;
  
  pWVar7 = pBuilder->pWC;
  __s = pIdxInfo->aConstraintUsage;
  pTemplate = pBuilder->pNew;
  pParse = pBuilder->pWInfo->pParse;
  pSVar8 = pBuilder->pWInfo->pTabList;
  bVar4 = pTemplate->iTab;
  iVar5 = pIdxInfo->nConstraint;
  lVar22 = (long)iVar5;
  *pbIn = 0;
  pTemplate->prereq = mPrereq;
  if (0 < lVar22) {
    pWVar9 = pWVar7->a;
    puVar16 = &pIdxInfo->aConstraint->usable;
    iVar21 = iVar5;
    do {
      *puVar16 = '\0';
      if (((pWVar9[*(int *)(puVar16 + 3)].prereqRight & ~mUsable) == 0) &&
         ((pWVar9[*(int *)(puVar16 + 3)].eOperator & mExclude) == 0)) {
        *puVar16 = '\x01';
      }
      puVar16 = puVar16 + 0xc;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  memset(__s,0,lVar22 * 8);
  pIdxInfo->idxStr = (char *)0x0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = 5e+98;
  pIdxInfo->estimatedRows = 0x19;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = pSVar8->a[bVar4].colUsed;
  pVVar17 = (pSVar8->a[bVar4].pTab)->pVTable;
  if (pVVar17 != (VTable *)0x0) {
    do {
      if (pVVar17->db == pParse->db) break;
      pVVar17 = pVVar17->pNext;
    } while (pVVar17 != (VTable *)0x0);
  }
  psVar10 = pVVar17->pVtab;
  uVar15 = (*psVar10->pModule->xBestIndex)(psVar10,pIdxInfo);
  if ((uVar15 != 0) && (uVar15 != 0x13)) {
    if (uVar15 == 7) {
      psVar11 = pParse->db;
      if ((psVar11->mallocFailed == '\0') && (psVar11->bBenignMalloc == '\0')) {
        psVar11->mallocFailed = '\x01';
        if (0 < psVar11->nVdbeExec) {
          (psVar11->u1).isInterrupted = 1;
        }
        (psVar11->lookaside).bDisable = (psVar11->lookaside).bDisable + 1;
      }
    }
    else {
      pcVar20 = psVar10->zErrMsg;
      if (pcVar20 == (char *)0x0) {
        if (uVar15 == 0x204) {
          pcVar20 = "abort due to ROLLBACK";
        }
        else if (uVar15 == 0x65) {
          pcVar20 = "no more rows available";
        }
        else if (uVar15 == 100) {
          pcVar20 = "another row available";
        }
        else {
          uVar19 = (ulong)uVar15 & 0xff;
          pcVar20 = "unknown error";
          if (((uint)uVar19 < 0x1d) && ((0x1410004UL >> ((ulong)uVar15 & 0x3f) & 1) == 0)) {
            pcVar20 = *(char **)(sqlite3ErrStr_aMsg + uVar19 * 8);
          }
        }
      }
      sqlite3ErrorMsg(pParse,"%s",pcVar20);
    }
  }
  sqlite3_free(psVar10->zErrMsg);
  psVar10->zErrMsg = (char *)0x0;
  if (uVar15 == 0x13) {
    uVar15 = 0;
  }
  else if (uVar15 == 0) {
    if (0 < iVar5) {
      lVar18 = 0;
      do {
        pTemplate->aLTerm[lVar18] = (WhereTerm *)0x0;
        lVar18 = lVar18 + 1;
      } while (lVar22 != lVar18);
    }
    (pTemplate->u).btree.nIdxCol = 0;
    if (iVar5 < 1) {
      uVar15 = 0xffffffff;
    }
    else {
      puVar16 = &pIdxInfo->aConstraint->usable;
      uVar15 = 0xffffffff;
      lVar18 = 0;
      do {
        iVar21 = __s[lVar18].argvIndex;
        bVar12 = true;
        if (0 < iVar21) {
          if (iVar21 <= iVar5) {
            uVar6 = *(uint *)(puVar16 + 3);
            if ((-1 < (int)uVar6) && ((int)uVar6 < pWVar7->nTerm)) {
              uVar1 = iVar21 - 1;
              if ((pTemplate->aLTerm[uVar1] == (WhereTerm *)0x0) && (*puVar16 != '\0')) {
                pWVar9 = pWVar7->a + uVar6;
                pTemplate->prereq = pTemplate->prereq | pWVar7->a[uVar6].prereqRight;
                pTemplate->aLTerm[uVar1] = pWVar9;
                if ((int)uVar15 < (int)uVar1) {
                  uVar15 = uVar1;
                }
                if ((iVar21 < 0x11) && (__s[lVar18].omit != '\0')) {
                  puVar2 = &(pTemplate->u).btree.nIdxCol;
                  *puVar2 = *puVar2 | (ushort)(1 << ((byte)uVar1 & 0x1f));
                }
                if ((pWVar9->eOperator & 1) != 0) {
                  pIdxInfo->orderByConsumed = 0;
                  *(byte *)&pIdxInfo->idxFlags = (byte)pIdxInfo->idxFlags & 0xfe;
                  *pbIn = 1;
                }
                goto LAB_001821ca;
              }
            }
          }
          bVar12 = false;
          sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(pSVar8->a[bVar4].pTab)->zName);
        }
LAB_001821ca:
        if (!bVar12) {
          return 1;
        }
        lVar18 = lVar18 + 1;
        puVar16 = puVar16 + 0xc;
      } while (lVar22 != lVar18);
    }
    puVar2 = &(pTemplate->u).btree.nIdxCol;
    *puVar2 = *puVar2 & ~mNoOmit;
    pTemplate->nLTerm = (u16)(uVar15 + 1);
    if (-1 < (int)uVar15) {
      uVar19 = 0;
      do {
        if (pTemplate->aLTerm[uVar19] == (WhereTerm *)0x0) {
          sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(pSVar8->a[bVar4].pTab)->zName);
          return 1;
        }
        uVar19 = uVar19 + 1;
      } while (uVar15 + 1 != uVar19);
    }
    (pTemplate->u).vtab.idxNum = pIdxInfo->idxNum;
    (pTemplate->u).vtab.needFree = (u8)pIdxInfo->needToFreeIdxStr;
    pIdxInfo->needToFreeIdxStr = 0;
    (pTemplate->u).btree.pIndex = (Index *)pIdxInfo->idxStr;
    if (pIdxInfo->orderByConsumed == 0) {
      iVar13 = '\0';
    }
    else {
      iVar13 = (i8)pIdxInfo->nOrderBy;
    }
    (pTemplate->u).vtab.isOrdered = iVar13;
    pTemplate->rSetup = 0;
    dVar3 = pIdxInfo->estimatedCost;
    if (dVar3 <= 1.0) {
      LVar14 = 0;
    }
    else if (dVar3 <= 2000000000.0) {
      LVar14 = sqlite3LogEst((long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f |
                             (long)dVar3);
    }
    else {
      LVar14 = (ushort)((ulong)dVar3 >> 0x34) * 10 + -0x27ec;
    }
    pTemplate->rRun = LVar14;
    LVar14 = sqlite3LogEst(pIdxInfo->estimatedRows);
    pTemplate->nOut = LVar14;
    pTemplate->wsFlags = (pIdxInfo->idxFlags & 1U) << 0xc | pTemplate->wsFlags & 0xffffefff;
    uVar15 = whereLoopInsert(pBuilder,pTemplate);
    if ((pTemplate->u).vtab.needFree != '\0') {
      sqlite3_free((pTemplate->u).btree.pIndex);
      (pTemplate->u).vtab.needFree = '\0';
    }
  }
  return uVar15;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn                       /* OUT: True if plan uses an IN(...) op */
){
  WhereClause *pWC = pBuilder->pWC;
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  struct SrcList_item *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by 
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = &pWC->a[pIdxCons->iTermOffset];
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight 
     && (pTerm->eOperator & mExclude)==0
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = (sqlite3_int64)pSrc->colUsed;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pTab, pIdxInfo);
  if( rc ){
    if( rc==SQLITE_CONSTRAINT ){
      /* If the xBestIndex method returns SQLITE_CONSTRAINT, that means
      ** that the particular combination of parameters provided is unusable.
      ** Make no entries in the loop table.
      */
      WHERETRACE(0xffff, ("  ^^^^--- non-viable plan rejected!\n"));
      return SQLITE_OK;
    }
    return rc;
  }

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  for(i=0; i<nConstraint; i++) pNew->aLTerm[i] = 0;
  pNew->u.vtab.omitMask = 0;
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || j>=pWC->nTerm
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
        testcase( pIdxInfo->needToFreeIdxStr );
        return SQLITE_ERROR;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pTerm = &pWC->a[j];
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( iTerm<16 && pUsage[i].omit ) pNew->u.vtab.omitMask |= 1<<iTerm;
      if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }
    }
  }
  pNew->u.vtab.omitMask &= ~mNoOmit;

  pNew->nLTerm = mxTerm+1;
  for(i=0; i<=mxTerm; i++){
    if( pNew->aLTerm[i]==0 ){
      /* The non-zero argvIdx values must be contiguous.  Raise an
      ** error if they are not */
      sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
      testcase( pIdxInfo->needToFreeIdxStr );
      return SQLITE_ERROR;
    }
  }
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}